

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * Lowerer::HoistIndirOffsetAsAdd
                  (Instr *instr,IndirOpnd *orgOpnd,Opnd *baseOpnd,int offset,RegNum regNum)

{
  StackSym *sym;
  RegOpnd *newBase;
  IntConstOpnd *src2Opnd;
  Instr *instr_00;
  
  sym = StackSym::New(TyUint64,instr->m_func);
  newBase = IR::RegOpnd::New(sym,regNum,TyUint64,instr->m_func);
  src2Opnd = IR::IntConstOpnd::New((long)offset,TyInt32,instr->m_func,false);
  instr_00 = IR::Instr::New(Add_A,&newBase->super_Opnd,baseOpnd,&src2Opnd->super_Opnd,instr->m_func)
  ;
  LowererMD::ChangeToAdd(instr_00,false);
  IR::Instr::InsertBefore(instr,instr_00);
  IR::IndirOpnd::ReplaceBaseOpnd(orgOpnd,newBase);
  orgOpnd->m_offset = 0;
  (orgOpnd->super_Opnd).field_0xe = 0;
  return instr_00;
}

Assistant:

IR::Instr *Lowerer::HoistIndirOffsetAsAdd(IR::Instr* instr, IR::IndirOpnd *orgOpnd, IR::Opnd *baseOpnd, int offset, RegNum regNum)
{
        IR::RegOpnd *newBaseOpnd = IR::RegOpnd::New(StackSym::New(TyMachPtr, instr->m_func), regNum, TyMachPtr, instr->m_func);

        IR::IntConstOpnd *src2 = IR::IntConstOpnd::New(offset, TyInt32, instr->m_func);

        IR::Instr * instrAdd = IR::Instr::New(Js::OpCode::Add_A, newBaseOpnd, baseOpnd, src2, instr->m_func);
        LowererMD::ChangeToAdd(instrAdd, false);
        instr->InsertBefore(instrAdd);

        orgOpnd->ReplaceBaseOpnd(newBaseOpnd);
        orgOpnd->SetOffset(0);

        return instrAdd;
}